

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cc
# Opt level: O0

void __thiscall
RegisterLexerReadIdentCurlies::RegisterLexerReadIdentCurlies(RegisterLexerReadIdentCurlies *this)

{
  RegisterLexerReadIdentCurlies *this_local;
  
  RegisterTest(LexerReadIdentCurlies::Create,"Lexer.ReadIdentCurlies");
  return;
}

Assistant:

TEST(Lexer, ReadIdentCurlies) {
  // Verify that ReadIdent includes dots in the name,
  // but in an expansion $bar.dots stops at the dot.
  Lexer lexer("foo.dots $bar.dots ${bar.dots}\n");
  string ident;
  EXPECT_TRUE(lexer.ReadIdent(&ident));
  EXPECT_EQ("foo.dots", ident);

  EvalString eval;
  string err;
  EXPECT_TRUE(lexer.ReadVarValue(&eval, &err));
  EXPECT_EQ("", err);
  EXPECT_EQ("[$bar][.dots ][$bar.dots]",
            eval.Serialize());
}